

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  xml_node_type child_00;
  xml_node_type parent_00;
  
  child_00 = node_null;
  parent_00 = node_null;
  if (parent._root != (xml_node_struct *)0x0) {
    parent_00 = (xml_node_type)(parent._root)->header & (node_doctype|node_declaration);
  }
  if (child._root != (xml_node_struct *)0x0) {
    child_00 = (xml_node_type)(child._root)->header & (node_doctype|node_declaration);
  }
  bVar1 = allow_insert_child(parent_00,child_00);
  if (bVar1) {
    if (parent._root == (xml_node_struct *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = *(long *)((long)parent._root - ((parent._root)->header >> 8)) + -0x40;
    }
    if (child._root == (xml_node_struct *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = *(long *)((long)child._root - ((child._root)->header >> 8)) + -0x40;
    }
    if (lVar2 == lVar3) {
      while( true ) {
        bVar1 = parent._root == (xml_node_struct *)0x0;
        if (bVar1) {
          return bVar1;
        }
        if (parent._root == child._root) break;
        parent._root = (parent._root)->parent;
      }
      return bVar1;
    }
  }
  return false;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}